

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_xpcall(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef *pTVar2;
  TValue *pTVar3;
  TValue TVar4;
  TValue TVar5;
  int errcode;
  
  if (1 < J->maxslot) {
    pTVar2 = J->base;
    TVar1 = *pTVar2;
    *pTVar2 = pTVar2[1];
    pTVar2[1] = TVar1;
    pTVar3 = rd->argv;
    TVar4 = *pTVar3;
    TVar5 = pTVar3[1];
    *pTVar3 = TVar5;
    rd->argv[1] = TVar4;
    errcode = lj_vm_cpcall(J->L,0,J,recff_xpcall_cp);
    *rd->argv = TVar4;
    rd->argv[1] = TVar5;
    if (errcode != 0) {
      lj_err_throw(J->L,errcode);
    }
    rd->nres = -1;
    J->needsnap = '\x01';
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_xpcall(jit_State *J, RecordFFData *rd)
{
  if (J->maxslot >= 2) {
    TValue argv0, argv1;
    TRef tmp;
    int errcode;
    /* Swap function and traceback. */
    tmp = J->base[0]; J->base[0] = J->base[1]; J->base[1] = tmp;
    copyTV(J->L, &argv0, &rd->argv[0]);
    copyTV(J->L, &argv1, &rd->argv[1]);
    copyTV(J->L, &rd->argv[0], &argv1);
    copyTV(J->L, &rd->argv[1], &argv0);
#if LJ_FR2
    /* Shift function arguments up. */
    memmove(J->base + 2, J->base + 1, sizeof(TRef) * (J->maxslot-1));
#endif
    /* Need to protect lj_record_call because it may throw. */
    errcode = lj_vm_cpcall(J->L, NULL, J, recff_xpcall_cp);
    /* Always undo Lua stack swap to avoid confusing the interpreter. */
    copyTV(J->L, &rd->argv[0], &argv0);
    copyTV(J->L, &rd->argv[1], &argv1);
    if (errcode)
      lj_err_throw(J->L, errcode);  /* Propagate errors. */
    rd->nres = -1;  /* Pending call. */
    J->needsnap = 1;  /* Start catching on-trace errors. */
  }  /* else: Interpreter will throw. */
}